

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O3

void __thiscall Prog::redraw(Prog *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Element *this_00;
  Element *pEVar7;
  int iVar8;
  int iVar9;
  pointer ppEVar10;
  float fVar11;
  
  uVar1._0_4_ = (this->ctx).bg.r;
  uVar1._4_4_ = (this->ctx).bg.g;
  uVar2._0_4_ = (this->ctx).bg.b;
  uVar2._4_4_ = (this->ctx).bg.a;
  al_clear_to_color(uVar1,uVar2);
  ppEVar10 = (this->elements).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppEVar10 !=
      (this->elements).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppEVar10;
      pEVar7 = this->cur_element;
      Element::draw(this_00,&this->ctx,this_00 == pEVar7);
      if ((this_00 == pEVar7) && (this->cur_button == 2)) {
        Element::draw_arrow(*ppEVar10,&this->ctx,this->connect_x,this->connect_y,true);
      }
      ppEVar10 = ppEVar10 + 1;
    } while (ppEVar10 !=
             (this->elements).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar8 = al_get_display_height(this->dpy);
  iVar9 = al_get_font_line_height((this->ctx).font);
  fVar11 = (float)iVar9;
  uVar3._0_4_ = (this->ctx).fg.r;
  uVar3._4_4_ = (this->ctx).fg.g;
  uVar4._0_4_ = (this->ctx).fg.b;
  uVar4._4_4_ = (this->ctx).fg.a;
  al_draw_textf(uVar3,uVar4,0,(float)iVar8 - (fVar11 + fVar11),(this->ctx).font,0,
                "Create [v]oices, [m]ixers, [s]ample instances, [a]udiostreams.   [SPACE] pause playback.    [1]-[9] set sample.    [x] delete."
               );
  uVar5._0_4_ = (this->ctx).fg.r;
  uVar5._4_4_ = (this->ctx).fg.g;
  uVar6._0_4_ = (this->ctx).fg.b;
  uVar6._4_4_ = (this->ctx).fg.a;
  al_draw_textf(uVar5,uVar6,0,(float)iVar8 - fVar11,(this->ctx).font,0,
                "Mouse: [LMB] select element.   [RMB] attach sources to sinks (sample->mixer, mixer->mixer, mixer->voice, sample->voice)"
               );
  al_flip_display();
  return;
}

Assistant:

void Prog::redraw()
{
   al_clear_to_color(ctx.bg);

   for (Element::iter it = elements.begin(); it != elements.end(); it++) {
      bool highlight = (*it == cur_element);
      (*it)->draw(ctx, highlight);

      if (highlight && cur_button == 2) {
         (*it)->draw_arrow(ctx, connect_x, connect_y, highlight);
      }
   }

   float y = al_get_display_height(dpy);
   float th = al_get_font_line_height(ctx.font);
   al_draw_textf(ctx.font, ctx.fg, 0, y-th*2, ALLEGRO_ALIGN_LEFT,
      "Create [v]oices, [m]ixers, [s]ample instances, [a]udiostreams.   "
      "[SPACE] pause playback.    "
      "[1]-[9] set sample.    "
      "[x] delete.");
   al_draw_textf(ctx.font, ctx.fg, 0, y-th*1, ALLEGRO_ALIGN_LEFT,
      "Mouse: [LMB] select element.   "
      "[RMB] attach sources to sinks "
      "(sample->mixer, mixer->mixer, mixer->voice, sample->voice)");

   al_flip_display();
}